

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O0

void __thiscall trento::Event::Event(Event *this,VarMap *var_map)

{
  double *pdVar1;
  anon_class_16_2_fd512ddd *in_RSI;
  long in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double p;
  string *in_stack_fffffffffffffd38;
  double dVar6;
  function<void_()> *in_stack_fffffffffffffd40;
  allocator<double> *in_stack_fffffffffffffd50;
  extent_gen<2UL> *in_stack_fffffffffffffd58;
  multi_array<double,_2UL,_std::allocator<double>_> *in_stack_fffffffffffffd60;
  function<void_()> *this_00;
  undefined1 local_169 [33];
  double local_148;
  pair<long,_long> local_138;
  pair<long,_long> local_100;
  pair<long,_long> local_c8;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  anon_class_16_2_fd512ddd *local_10;
  
  local_10 = in_RSI;
  std::function<void_()>::function(in_stack_fffffffffffffd40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"normalization",&local_31);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  pdVar1 = boost::program_options::variable_value::as<double>((variable_value *)0x12d72a);
  dVar6 = *pdVar1;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *(double *)(in_RDI + 0x20) = dVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"grid-step",&local_69);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  pdVar1 = boost::program_options::variable_value::as<double>((variable_value *)0x12d7fb);
  dVar6 = *pdVar1;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  *(double *)(in_RDI + 0x28) = dVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"grid-max",&local_91);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  pdVar1 = boost::program_options::variable_value::as<double>((variable_value *)0x12d8cc);
  dVar6 = *pdVar1 + *pdVar1;
  auVar4._0_8_ = dVar6 / *(double *)(in_RDI + 0x28);
  auVar4._8_8_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar6;
  auVar2 = vroundsd_avx(auVar2,auVar4,10);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  *(int *)(in_RDI + 0x30) = (int)auVar2._0_8_;
  *(double *)(in_RDI + 0x38) = (double)*(int *)(in_RDI + 0x30) * 0.5 * *(double *)(in_RDI + 0x28);
  local_c8 = (pair<long,_long>)
             boost::detail::multi_array::extent_gen<0UL>::operator[]
                       ((extent_gen<0UL> *)in_stack_fffffffffffffd60,
                        (index)in_stack_fffffffffffffd58);
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<1UL> *)in_stack_fffffffffffffd60,(index)in_stack_fffffffffffffd58);
  std::allocator<double>::allocator((allocator<double> *)0x12d9da);
  boost::multi_array<double,_2UL,_std::allocator<double>_>::multi_array
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::allocator<double>::~allocator((allocator<double> *)0x12da03);
  local_100 = (pair<long,_long>)
              boost::detail::multi_array::extent_gen<0UL>::operator[]
                        ((extent_gen<0UL> *)in_stack_fffffffffffffd60,
                         (index)in_stack_fffffffffffffd58);
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<1UL> *)in_stack_fffffffffffffd60,(index)in_stack_fffffffffffffd58);
  std::allocator<double>::allocator((allocator<double> *)0x12da85);
  boost::multi_array<double,_2UL,_std::allocator<double>_>::multi_array
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::allocator<double>::~allocator((allocator<double> *)0x12daab);
  local_138 = (pair<long,_long>)
              boost::detail::multi_array::extent_gen<0UL>::operator[]
                        ((extent_gen<0UL> *)in_stack_fffffffffffffd60,
                         (index)in_stack_fffffffffffffd58);
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<1UL> *)in_stack_fffffffffffffd60,(index)in_stack_fffffffffffffd58);
  std::allocator<double>::allocator((allocator<double> *)0x12db2d);
  boost::multi_array<double,_2UL,_std::allocator<double>_>::multi_array
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::allocator<double>::~allocator((allocator<double> *)0x12db53);
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             0x12db6c);
  this_00 = (function<void_()> *)local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_169 + 1),"reduced-thickness",(allocator *)this_00);
  boost::program_options::variables_map::operator[]
            ((variables_map *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  pdVar1 = boost::program_options::variable_value::as<double>((variable_value *)0x12dbc9);
  dVar6 = *pdVar1;
  std::__cxx11::string::~string((string *)(local_169 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_169);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar6;
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar2 = vpand_avx(auVar3,auVar5);
  local_148 = dVar6;
  if (1e-12 <= auVar2._0_8_) {
    if (dVar6 <= 0.0) {
      std::function<void()>::operator=(this_00,local_10);
    }
    else {
      std::function<void()>::operator=(this_00,local_10);
    }
  }
  else {
    std::function<void()>::operator=(this_00,(anon_class_8_1_8991fb9c *)local_10);
  }
  return;
}

Assistant:

Event::Event(const VarMap& var_map)
    : norm_(var_map["normalization"].as<double>()),
      dxy_(var_map["grid-step"].as<double>()),
      nsteps_(std::ceil(2.*var_map["grid-max"].as<double>()/dxy_)),
      xymax_(.5*nsteps_*dxy_),
      TA_(boost::extents[nsteps_][nsteps_]),
      TB_(boost::extents[nsteps_][nsteps_]),
      TR_(boost::extents[nsteps_][nsteps_]) {
  // Choose which version of the generalized mean to use based on the
  // configuration.  The possibilities are defined above.  See the header for
  // more information.
  auto p = var_map["reduced-thickness"].as<double>();

  if (std::fabs(p) < TINY) {
    compute_reduced_thickness_ = [this]() {
      compute_reduced_thickness(geometric_mean);
    };
  } else if (p > 0.) {
    compute_reduced_thickness_ = [this, p]() {
      compute_reduced_thickness(
        [p](double a, double b) { return positive_pmean(p, a, b); });
    };
  } else {
    compute_reduced_thickness_ = [this, p]() {
      compute_reduced_thickness(
        [p](double a, double b) { return negative_pmean(p, a, b); });
    };
  }
}